

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int SetLidarSpinSpeedRequestRPLIDAR(RPLIDAR *pRPLIDAR,int rpm)

{
  uchar uVar1;
  int iVar2;
  undefined3 local_22;
  undefined1 uStack_1f;
  undefined2 local_1e;
  undefined1 auStack_1c [2];
  uchar reqbuf [6];
  int rpm_local;
  RPLIDAR *pRPLIDAR_local;
  
  _local_22 = CONCAT13((char)rpm,0x2a8a5);
  local_1e = (ushort)(byte)((uint)rpm >> 8);
  _auStack_1c = rpm;
  unique0x10000079 = pRPLIDAR;
  uVar1 = ComputeChecksumRPLIDAR((uchar *)&local_22,6);
  local_1e = CONCAT11(uVar1,(undefined1)local_1e);
  iVar2 = WriteAllRS232Port(&stack0xffffffffffffffe8->RS232Port,(uint8 *)&local_22,6);
  if (iVar2 != 0) {
    printf("Error writing data to a RPLIDAR. \n");
  }
  pRPLIDAR_local._4_4_ = (uint)(iVar2 != 0);
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int SetLidarSpinSpeedRequestRPLIDAR(RPLIDAR* pRPLIDAR, int rpm)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
#ifdef SLAMTEC_LIDAR_SDK_VERSION
	if (IS_FAIL(pRPLIDAR->drv->setMotorPWM((_u16)rpm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorPWM() failed. \n");
		return EXIT_FAILURE;
	}
#else
	if (IS_FAIL(pRPLIDAR->drv->setLidarSpinSpeed((_u16)rpm)))
	{
		printf("A RPLIDAR is not responding correctly : setLidarSpinSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // SLAMTEC_LIDAR_SDK_VERSION
#else
	if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed((sl_u16)rpm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SET_MOTOR_SPEED_CTRL_REQUEST_RPLIDAR,0x02,0,0,0};

	reqbuf[3] = (unsigned char)rpm;
	reqbuf[4] = (unsigned char)(rpm>>8);
	reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}